

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::WFElemStack::addLevel(WFElemStack *this,XMLCh *toSet,uint toSetLen,uint readerNum)

{
  StackElem **ppSVar1;
  int iVar2;
  XMLSize_t XVar3;
  StackElem *pSVar4;
  undefined4 extraout_var;
  uint uVar5;
  size_t __n;
  
  XVar3 = this->fStackTop;
  if (XVar3 == this->fStackCapacity) {
    expandStack(this);
    XVar3 = this->fStackTop;
  }
  pSVar4 = this->fStack[XVar3];
  if (pSVar4 == (StackElem *)0x0) {
    pSVar4 = (StackElem *)XMemory::operator_new(0x18,this->fMemoryManager);
    XVar3 = this->fStackTop;
    this->fStack[XVar3] = pSVar4;
    ppSVar1 = this->fStack;
    ppSVar1[XVar3]->fThisElement = (XMLCh *)0x0;
    pSVar4 = ppSVar1[XVar3];
    pSVar4->fElemMaxLength = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = pSVar4->fElemMaxLength;
  }
  pSVar4->fCurrentURI = this->fUnknownNamespaceId;
  pSVar4->fTopPrefix = -1;
  if (uVar5 < toSetLen) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pSVar4->fThisElement);
    this->fStack[this->fStackTop]->fElemMaxLength = toSetLen;
    __n = (ulong)(toSetLen + 1) * 2;
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    XVar3 = this->fStackTop;
    ppSVar1 = this->fStack;
    ppSVar1[XVar3]->fThisElement = (XMLCh *)CONCAT44(extraout_var,iVar2);
    pSVar4 = ppSVar1[XVar3];
  }
  else {
    __n = (ulong)(toSetLen + 1) * 2;
  }
  memmove(pSVar4->fThisElement,toSet,__n);
  XVar3 = this->fStackTop;
  ppSVar1 = this->fStack;
  pSVar4 = ppSVar1[XVar3];
  pSVar4->fReaderNum = readerNum;
  if (XVar3 != 0) {
    pSVar4->fTopPrefix = ppSVar1[XVar3 - 1]->fTopPrefix;
  }
  this->fStackTop = XVar3 + 1;
  return XVar3;
}

Assistant:

XMLSize_t
WFElemStack::addLevel(const XMLCh* const toSet,
                      const unsigned int toSetLen,
                      const unsigned int readerNum)
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fThisElement = 0;
        fStack[fStackTop]->fElemMaxLength = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fTopPrefix = -1;

    // And store the new stuff
    if (toSetLen > fStack[fStackTop]->fElemMaxLength) {

        fMemoryManager->deallocate(fStack[fStackTop]->fThisElement);//delete [] fStack[fStackTop]->fThisElement;
        fStack[fStackTop]->fElemMaxLength = toSetLen;
        fStack[fStackTop]->fThisElement = (XMLCh*) fMemoryManager->allocate
        (
            (toSetLen + 1) * sizeof(XMLCh)
        );//new XMLCh[toSetLen + 1];
    }

    XMLString::moveChars(fStack[fStackTop]->fThisElement, toSet, toSetLen + 1);
    fStack[fStackTop]->fReaderNum = readerNum;

    if (fStackTop != 0)
        fStack[fStackTop]->fTopPrefix = fStack[fStackTop - 1]->fTopPrefix;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}